

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O1

error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
pstore::romfs::romfs::dir_to_string_abi_cxx11_
          (error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,romfs *this,not_null<const_pstore::romfs::directory_*> dir)

{
  not_null<const_pstore::romfs::directory_*> dir_00;
  pointer pcVar1;
  iterator iVar2;
  iterator iVar3;
  error_code *peVar4;
  not_null<const_pstore::romfs::directory_*> *pnVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  int line;
  char *str;
  error_code eVar8;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [24];
  anon_union_32_2_eb5a95ea_for_error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
  local_58;
  bool local_38;
  
  if ((this->root_).ptr_ == dir.ptr_) {
    error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
              ((error_or<std::__cxx11::string> *)__return_storage_ptr__,(char (*) [2])0x1407c9);
  }
  else {
    local_58.storage_.__align = (anon_struct_8_0_00000001_for___align)0x13c6e6;
    pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_58);
    iVar2 = directory::find(dir.ptr_,(not_null<const_char_*>)local_58.storage_._0_8_,2);
    iVar3 = directory::end(dir.ptr_);
    if (iVar2.pos_ == iVar3.pos_) {
      assert_failed("parent_de != dir->end () && \"All directories must contain a \'..\' entry\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x168);
    }
    dirent::opendir((dirent *)local_70,(char *)iVar2.pos_);
    if (local_70[0x10] == false) {
      pnVar5 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
               value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                         ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                          local_70);
      dir_00.ptr_ = pnVar5->ptr_;
      dir_to_string_abi_cxx11_
                ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,this,dir_00);
      if (local_38 == false) {
        pbVar6 = error_or<std::__cxx11::string>::
                 value_storage_impl<pstore::error_or<std::__cxx11::string>&,std::__cxx11::string>
                           ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58);
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + pbVar6->_M_string_length);
        if (local_88 == 0) {
          line = 0x16c;
          str = "s.length () > 0";
LAB_00135d53:
          assert_failed(str,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                        ,line);
        }
        if (*(char *)((long)local_90 + local_88 + -1) != '/') {
          std::__cxx11::string::push_back((char)&local_90);
        }
        iVar2 = directory::find(dir_00.ptr_,dir);
        iVar3 = directory::end(dir.ptr_);
        if (iVar2.pos_ == iVar3.pos_) {
          line = 0x172;
          str = "p != dir->end ()";
          goto LAB_00135d53;
        }
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        __return_storage_ptr__->has_error_ = false;
        pbVar6 = error_or<std::__cxx11::string>::
                 value_storage_impl<pstore::error_or<std::__cxx11::string>&,std::__cxx11::string>
                           (__return_storage_ptr__);
        (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
        std::__cxx11::string::_M_construct<char*>((string *)pbVar6,*plVar7,plVar7[1] + *plVar7);
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      else {
        eVar8 = error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get_error((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58);
        __return_storage_ptr__->has_error_ = true;
        peVar4 = error_or<std::__cxx11::string>::
                 error_storage_impl<pstore::error_or<std::__cxx11::string>&,std::error_code>
                           (__return_storage_ptr__);
        peVar4->_M_value = eVar8._M_value;
        peVar4->_M_cat = eVar8._M_cat;
      }
      error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~error_or((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58);
    }
    else {
      eVar8 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         local_70);
      __return_storage_ptr__->has_error_ = true;
      peVar4 = error_or<std::__cxx11::string>::
               error_storage_impl<pstore::error_or<std::__cxx11::string>&,std::error_code>
                         (__return_storage_ptr__);
      peVar4->_M_value = eVar8._M_value;
      peVar4->_M_cat = eVar8._M_cat;
    }
    if (local_70[0x10] == false) {
      error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
      value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_70);
    }
    else {
      error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
      error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<std::string> romfs::dir_to_string (not_null<directory const *> const dir) const {
            if (dir == root_) {
                return error_or<std::string>{"/"};
            }
            auto const parent_de = dir->find ("..");
            PSTORE_ASSERT (parent_de != dir->end () && "All directories must contain a '..' entry");
            return parent_de->opendir () >>=
                   [this, dir] (not_null<directory const *> const parent) {
                       return this->dir_to_string (parent) >>= [dir, parent] (std::string s) {
                           PSTORE_ASSERT (s.length () > 0);
                           if (s.back () != '/') {
                               s += '/';
                           }

                           auto const p = parent->find (dir);
                           PSTORE_ASSERT (p != dir->end ());
                           return error_or<std::string> (s.append (p->name ().get ()));
                       };
                   };
        }